

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

xmlLinkPtr xmlListLinkSearch(xmlListPtr l,void *data)

{
  int iVar1;
  xmlLinkPtr lk;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local = (xmlListPtr)0x0;
  }
  else {
    l_local = (xmlListPtr)xmlListLowerSearch(l,data);
    if ((xmlLinkPtr)l_local == l->sentinel) {
      l_local = (xmlListPtr)0x0;
    }
    else {
      iVar1 = (*l->linkCompare)(((xmlLinkPtr)l_local)->data,data);
      if (iVar1 != 0) {
        l_local = (xmlListPtr)0x0;
      }
    }
  }
  return (xmlLinkPtr)l_local;
}

Assistant:

static xmlLinkPtr
xmlListLinkSearch(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;
    if (l == NULL)
        return(NULL);
    lk = xmlListLowerSearch(l, data);
    if (lk == l->sentinel)
        return NULL;
    else {
        if (l->linkCompare(lk->data, data) ==0)
            return lk;
        return NULL;
    }
}